

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

void (anonymous_namespace)::InfoWriter::
     MakeStringArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (Value *jval,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *container)

{
  pointer pbVar1;
  Value *this;
  ArrayIndex index;
  ulong uVar2;
  pointer value;
  Value local_50;
  
  Json::Value::Value(&local_50,arrayValue);
  Json::Value::operator=(jval,&local_50);
  Json::Value::~Value(&local_50);
  uVar2 = (long)(container->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(container->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar2 != 0) {
    Json::Value::resize(jval,(ArrayIndex)(uVar2 >> 5));
    value = (container->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (container->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (value != pbVar1) {
      index = 0;
      do {
        Json::Value::Value(&local_50,value);
        this = Json::Value::operator[](jval,index);
        index = index + 1;
        Json::Value::operator=(this,&local_50);
        Json::Value::~Value(&local_50);
        value = value + 1;
      } while (value != pbVar1);
    }
  }
  return;
}

Assistant:

void InfoWriter::MakeStringArray(Json::Value& jval, CONT const& container)
{
  if (MakeArray(jval, container)) {
    Json::ArrayIndex ii = 0;
    for (std::string const& item : container) {
      jval[ii++] = item;
    }
  }
}